

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O2

_Bool do_cmd_disarm_aux(loc grid)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  square *psVar5;
  int iVar6;
  trap *trap;
  
  psVar5 = square(cave,grid);
  trap = psVar5->trap;
  _Var1 = do_cmd_disarm_test(player,grid);
  if (_Var1) {
    for (; trap != (trap *)0x0; trap = trap->next) {
      _Var1 = flag_has_dbg(trap->flags,2,2,"trap->flags","TRF_TRAP");
      if (_Var1) {
        _Var1 = flag_has_dbg(trap->flags,2,9,"trap->flags","TRF_MAGICAL");
        iVar2 = (player->state).skills[_Var1];
        if ((((player->timed[2] != 0) || (_Var1 = no_light(player), _Var1)) ||
            (player->timed[4] != 0)) || (player->timed[6] != 0)) {
          iVar2 = iVar2 / 10;
        }
        iVar3 = cave->depth / 5;
        iVar2 = iVar2 - iVar3;
        iVar6 = 2;
        if (2 < iVar2) {
          iVar6 = iVar2;
        }
        uVar4 = Rand_div(100);
        if ((int)uVar4 < iVar6) {
          msgt(0x58,"You have disarmed the %s.",trap->kind->name);
          player_exp_gain(player,iVar3 + 1);
          _Var1 = square_remove_trap((chunk *)cave,grid,trap,true);
          if (_Var1) {
            return false;
          }
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-cave.c"
                        ,0x336,"_Bool do_cmd_disarm_aux(struct loc)");
        }
        uVar4 = Rand_div(100);
        if ((int)uVar4 < iVar6) {
          event_signal(EVENT_INPUT_FLUSH);
          msg("You failed to disarm the %s.",trap->kind->name);
          return true;
        }
        msg("You set off the %s!",trap->kind->name);
        hit_trap(grid,L'\xffffffff');
        return false;
      }
    }
  }
  return false;
}

Assistant:

static bool do_cmd_disarm_aux(struct loc grid)
{
	int skill, power, chance;
    struct trap *trap = square(cave, grid)->trap;
	bool more = false;

	/* Verify legality */
	if (!do_cmd_disarm_test(player, grid)) return (false);

    /* Choose first player trap */
	while (trap) {
		if (trf_has(trap->flags, TRF_TRAP))
			break;
		trap = trap->next;
	}
	if (!trap)
		return false;

	/* Get the base disarming skill */
	if (trf_has(trap->flags, TRF_MAGICAL))
		skill = player->state.skills[SKILL_DISARM_MAGIC];
	else
		skill = player->state.skills[SKILL_DISARM_PHYS];

	/* Penalize some conditions */
	if (player->timed[TMD_BLIND] ||
			no_light(player) ||
			player->timed[TMD_CONFUSED] ||
			player->timed[TMD_IMAGE])
		skill = skill / 10;

	/* Extract trap power */
	power = cave->depth / 5;

	/* Extract the percentage success */
	chance = skill - power;

	/* Always have a small chance of success */
	if (chance < 2) chance = 2;

	/* Two chances - one to disarm, one not to set the trap off */
	if (randint0(100) < chance) {
		msgt(MSG_DISARM, "You have disarmed the %s.", trap->kind->name);
		player_exp_gain(player, 1 + power);

		/* Trap is gone */
		if (!square_remove_trap(cave, grid, trap, true)) {
			assert(0);
		}
	} else if (randint0(100) < chance) {
		event_signal(EVENT_INPUT_FLUSH);
		msg("You failed to disarm the %s.", trap->kind->name);

		/* Player can try again */
		more = true;
	} else {
		msg("You set off the %s!", trap->kind->name);
		hit_trap(grid, -1);
	}

	/* Result */
	return (more);
}